

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

string * __thiscall
pstore::file::system_error::message<char_const*>
          (string *__return_storage_ptr__,system_error *this,char **user_message,string *path)

{
  long lVar1;
  ostream *poVar2;
  ostringstream local_1a0 [8];
  ostringstream stream;
  string *path_local;
  char **user_message_local;
  system_error *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,*user_message);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    poVar2 = std::operator<<((ostream *)local_1a0," \"");
    poVar2 = std::operator<<(poVar2,(string *)path);
    std::operator<<(poVar2,'\"');
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string system_error::message (MessageStringType const & user_message,
                                           std::string const & path) {
            std::ostringstream stream;
            stream << user_message;
            if (path.length () > 0) {
                stream << " \"" << path << '\"';
            }
            return stream.str ();
        }